

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qladisp.cpp
# Opt level: O2

bool CollectFileConvert(char *inFilename,char *outFilename)

{
  ostream *poVar1;
  bool bVar2;
  quadlet_t value;
  ofstream outFile;
  uint auStack_420 [122];
  ifstream inFile;
  int aiStack_218 [122];
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Converting data collection file ");
  poVar1 = std::operator<<(poVar1,inFilename);
  poVar1 = std::operator<<(poVar1," to ");
  poVar1 = std::operator<<(poVar1,outFilename);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ifstream::ifstream(&inFile,inFilename,_S_bin);
  if (*(int *)((long)aiStack_218 + *(long *)(_inFile + -0x18)) == 0) {
    std::ofstream::ofstream(&outFile,outFilename,_S_trunc);
    bVar2 = *(int *)((long)auStack_420 + *(long *)(_outFile + -0x18) + 8) == 0;
    if (bVar2) {
      while (*(int *)((long)aiStack_218 + *(long *)(_inFile + -0x18)) == 0) {
        std::istream::read((char *)&inFile,(long)&value);
        *(uint *)((long)auStack_420 + *(long *)(_outFile + -0x18)) =
             *(uint *)((long)auStack_420 + *(long *)(_outFile + -0x18)) & 0xffffffb5 | 2;
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&outFile);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      std::ifstream::close();
      std::ofstream::close();
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cerr,"Failed to open output data collection file ");
      poVar1 = std::operator<<(poVar1,outFilename);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::ofstream::~ofstream(&outFile);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Failed to open input data collection file ");
    poVar1 = std::operator<<(poVar1,inFilename);
    std::endl<char,std::char_traits<char>>(poVar1);
    bVar2 = false;
  }
  std::ifstream::~ifstream(&inFile);
  return bVar2;
}

Assistant:

bool CollectFileConvert(const char *inFilename, const char *outFilename)
{
    std::cerr << "Converting data collection file " << inFilename << " to " << outFilename << std::endl;
    std::ifstream inFile(inFilename, std::ifstream::binary);
    if (!inFile.good()) {
        std::cerr << "Failed to open input data collection file " << inFilename << std::endl;
        return false;
    }
    std::ofstream outFile(outFilename, std::ofstream::trunc);
    if (!outFile.good()) {
        std::cerr << "Failed to open output data collection file " << outFilename << std::endl;
        return false;
    }
    quadlet_t value;
    while (inFile.good()) {
        inFile.read(reinterpret_cast<char *>(&value), sizeof(quadlet_t));
        outFile << std::dec
                << ((value&0x80000000)>>31) << ", "    // type (0->commanded current, 1-> measured current)
                << ((value&0x40000000)>>30) << ", "    // timer overflow
                << ((value&0x3FFF0000)>>16) << ", "    // timer (14-bits)
                << (value&0x0000FFFF)                  // data
                << std::endl;
    }
    inFile.close();
    outFile.close();
    return true;
}